

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

char * inputline(void)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *buf;
  
  ::buf[0] = '\0';
  Gets(::buf);
  sVar2 = strlen(::buf);
  if ((int)sVar2 != 0) {
    ::buf[(int)sVar2 + -1] = '\0';
  }
  buf = ::buf;
  pcVar3 = index(::buf,0x21);
  if (pcVar3 != (char *)0x0) goto LAB_00103a8d;
  pcVar3 = (char *)0x0;
  while (((char *)((long)&endblk + 7) < pcVar3 &&
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)*pcVar3 * 2 + 1) & 0x20) != 0
         ))) {
LAB_00103a8d:
    *pcVar3 = '\0';
    pcVar3 = pcVar3 + -1;
  }
  while ((cVar1 = *buf, (long)cVar1 != 0 &&
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0))
        ) {
    buf = buf + 1;
  }
  pcVar3 = stralloc(buf,(char *)0x0);
  return pcVar3;
}

Assistant:

char *inputline()
{
	/* and removes comment, newline, beginning and trailing blanks */
	/* used to get the TITLE line */
	char            *cp;
	int             i;

	buf[0] = '\0';
	cp = Gets(buf);
	i = strlen(buf);
	if (i)
		buf[i - 1] = '\0';
	if ((cp = index(buf, '!')) != (char *) 0) {
		*cp-- = '\0';
	}
	while (cp >= buf && isspace(*cp)) {
		*cp-- = '\0';
	}
	/*EMPTY*/
	for (cp = buf; *cp != '\0' && isspace(*cp); cp++){
		;
	}
	return stralloc(cp, (char *) 0);
}